

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

bool __thiscall
iDynTree::Model::addAdditionalFrameToLink
          (Model *this,string *linkName,string *frameName,Transform *link_H_frame)

{
  byte bVar1;
  char *pcVar2;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *in_RCX;
  string *in_RDX;
  string error_1;
  string error;
  LinkIndex linkIndex;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  value_type *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_120 [16];
  string *in_stack_fffffffffffffef0;
  Model *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  string local_e0 [16];
  string *in_stack_ffffffffffffff30;
  Model *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  LinkIndex local_30;
  string *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  local_30 = getLinkIndex(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (local_30 == LINK_INVALID_INDEX) {
    __lhs = &local_b0;
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("Model","addAdditionalFrameToLink",pcVar2);
    local_1 = 0;
    std::__cxx11::string::~string(local_50);
  }
  else {
    std::__cxx11::string::string(local_e0,local_20);
    bVar1 = isFrameNameUsed(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_e0);
    if ((bVar1 & 1) == 0) {
      std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::push_back
                (in_RCX,(value_type *)in_stack_fffffffffffffec8);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)in_RCX,
                 (value_type_conflict2 *)in_stack_fffffffffffffec8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RCX,in_stack_fffffffffffffec8);
      local_1 = 1;
    }
    else {
      std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::operator+(in_stack_fffffffffffffec8,(char *)CONCAT17(bVar1,in_stack_fffffffffffffec0));
      std::__cxx11::string::~string(local_120);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("Model","addAdditionalFrameToLink",pcVar2);
      local_1 = 0;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Model::addAdditionalFrameToLink(const std::string& linkName,
                                     const std::string& frameName,
                                     Transform link_H_frame)
{
    // Check that the link actually exist
    LinkIndex linkIndex = this->getLinkIndex(linkName);
    if( linkIndex == LINK_INVALID_INDEX )
    {
        std::string error = "error adding frame " + frameName + " : a link of name "
                            + linkName + " is not present in the model";
        reportError("Model","addAdditionalFrameToLink",error.c_str());
        return false;
    }

    // Check that the frame name is not already used by a link or frame
    if(isFrameNameUsed(frameName))
    {
        std::string error = "a link or frame of name " + frameName + " is already present in the model";
        reportError("Model","addAdditionalFrameToLink",error.c_str());
        return false;
    }

    // If all error has passed, actually add the frame
    assert(additionalFrames.size() == additionalFramesLinks.size());
    assert(additionalFrames.size() == frameNames.size());
    this->additionalFrames.push_back(link_H_frame);
    this->additionalFramesLinks.push_back(linkIndex);
    this->frameNames.push_back(frameName);

    return true;
}